

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

bool __thiscall cmsys::RegularExpression::find(RegularExpression *this,char *string)

{
  char cVar1;
  char *__s2;
  size_t __n;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  
  this->searchstring = string;
  pcVar5 = this->program;
  if (pcVar5 != (char *)0x0) {
    if (*pcVar5 == -100) {
      __s2 = this->regmust;
      if (__s2 != (char *)0x0) {
        cVar1 = *__s2;
        __n = this->regmlen;
        pcVar4 = string;
        do {
          pcVar4 = strchr(pcVar4,(int)cVar1);
          if (pcVar4 == (char *)0x0) goto LAB_003cf640;
          iVar2 = strncmp(pcVar4,__s2,__n);
          pcVar4 = pcVar4 + 1;
        } while (iVar2 != 0);
      }
      regbol = string;
      if (this->reganch == '\0') {
        if (this->regstart == '\0') {
          do {
            uVar3 = regtry(string,this->startp,this->endp,this->program);
            if (uVar3 != 0) break;
            cVar1 = *string;
            string = string + 1;
          } while (cVar1 != '\0');
        }
        else {
          do {
            pcVar5 = strchr(string,(int)this->regstart);
            uVar3 = (uint)(pcVar5 != (char *)0x0);
            if (pcVar5 == (char *)0x0) break;
            iVar2 = regtry(pcVar5,this->startp,this->endp,this->program);
            string = pcVar5 + 1;
          } while (iVar2 == 0);
        }
      }
      else {
        uVar3 = regtry(string,this->startp,this->endp,pcVar5);
      }
      goto LAB_003cf642;
    }
    puts("RegularExpression::find(): Compiled regular expression corrupted.");
  }
LAB_003cf640:
  uVar3 = 0;
LAB_003cf642:
  return SUB41(uVar3,0);
}

Assistant:

bool RegularExpression::find (const char* string) {
    const char* s;

    this->searchstring = string;

    if (!this->program)
      {
      return false;
      }

    // Check validity of program.
    if (UCHARAT(this->program) != MAGIC) {
        //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf ("RegularExpression::find(): Compiled regular expression corrupted.\n");
        return 0;
    }

    // If there is a "must appear" string, look for it.
    if (this->regmust != 0) {
        s = string;
        while ((s = strchr(s, this->regmust[0])) != 0) {
            if (strncmp(s, this->regmust, this->regmlen) == 0)
                break;          // Found it.
            s++;
        }
        if (s == 0)             // Not present.
            return (0);
    }

    // Mark beginning of line for ^ .
    regbol = string;

    // Simplest case:  anchored match need be tried only once.
    if (this->reganch)
        return (regtry(string, this->startp, this->endp, this->program) != 0);

    // Messy cases:  unanchored match.
    s = string;
    if (this->regstart != '\0')
        // We know what char it must start with.
        while ((s = strchr(s, this->regstart)) != 0) {
            if (regtry(s, this->startp, this->endp, this->program))
                return (1);
            s++;

        }
    else
        // We don't -- general case.
        do {
            if (regtry(s, this->startp, this->endp, this->program))
                return (1);
        } while (*s++ != '\0');

    // Failure.
    return (0);
}